

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

bool __thiscall
RegVmLoweredFunction::TransferRegisterTo(RegVmLoweredFunction *this,VmValue *value,uchar reg)

{
  uchar uVar1;
  bool bVar2;
  uchar *puVar3;
  unsigned_short *puVar4;
  uint uVar5;
  SmallArray<unsigned_char,_16U> *pSVar6;
  byte local_29;
  
  local_29 = reg;
  if ((value == (VmValue *)0x0) || (value->typeID != 2)) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0xe3,"bool RegVmLoweredFunction::TransferRegisterTo(VmValue *, unsigned char)");
  }
  bVar2 = anon_unknown.dwarf_e255d::IsNonLocalValue((VmInstruction *)value);
  uVar5 = 0;
  if (!bVar2) {
    pSVar6 = &this->constantRegisters;
    for (; uVar5 < (this->constantRegisters).count; uVar5 = uVar5 + 1) {
      puVar3 = SmallArray<unsigned_char,_16U>::operator[](pSVar6,uVar5);
      if (*puVar3 == reg) {
        puVar4 = FixedArray<unsigned_short,_256U>::operator[](&this->registerUsers,(uint)reg);
        if (*puVar4 != 1) {
          __assert_fail("registerUsers[reg] == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0xec,
                        "bool RegVmLoweredFunction::TransferRegisterTo(VmValue *, unsigned char)");
        }
        puVar3 = SmallArray<unsigned_char,_16U>::back(pSVar6);
        uVar1 = *puVar3;
        puVar3 = SmallArray<unsigned_char,_16U>::operator[](pSVar6,uVar5);
        *puVar3 = uVar1;
        SmallArray<unsigned_char,_16U>::pop_back(pSVar6);
        SmallArray<unsigned_char,_8U>::push_back
                  ((SmallArray<unsigned_char,_8U> *)(value[1].users.little + 2),&local_29);
        goto LAB_00179b26;
      }
    }
    pSVar6 = &this->delayedFreedRegisters;
    for (uVar5 = 0; uVar5 < (this->delayedFreedRegisters).count; uVar5 = uVar5 + 1) {
      puVar3 = SmallArray<unsigned_char,_16U>::operator[](pSVar6,uVar5);
      if (*puVar3 == reg) {
        puVar4 = FixedArray<unsigned_short,_256U>::operator[](&this->registerUsers,(uint)reg);
        if (*puVar4 != 0) {
          __assert_fail("registerUsers[reg] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0xfb,
                        "bool RegVmLoweredFunction::TransferRegisterTo(VmValue *, unsigned char)");
        }
        goto LAB_00179adf;
      }
    }
    pSVar6 = &this->freedRegisters;
    for (uVar5 = 0; uVar5 < (this->freedRegisters).count; uVar5 = uVar5 + 1) {
      puVar3 = SmallArray<unsigned_char,_16U>::operator[](pSVar6,uVar5);
      if (*puVar3 == reg) {
        puVar4 = FixedArray<unsigned_short,_256U>::operator[](&this->registerUsers,(uint)reg);
        if (*puVar4 != 0) {
          __assert_fail("registerUsers[reg] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0x10c,
                        "bool RegVmLoweredFunction::TransferRegisterTo(VmValue *, unsigned char)");
        }
LAB_00179adf:
        puVar3 = SmallArray<unsigned_char,_16U>::back(pSVar6);
        uVar1 = *puVar3;
        puVar3 = SmallArray<unsigned_char,_16U>::operator[](pSVar6,uVar5);
        *puVar3 = uVar1;
        SmallArray<unsigned_char,_16U>::pop_back(pSVar6);
        SmallArray<unsigned_char,_8U>::push_back
                  ((SmallArray<unsigned_char,_8U> *)(value[1].users.little + 2),&local_29);
        puVar4 = FixedArray<unsigned_short,_256U>::operator[](&this->registerUsers,(uint)local_29);
        *puVar4 = *puVar4 + 1;
LAB_00179b26:
        uVar5 = 1;
        goto LAB_00179b29;
      }
    }
    uVar5 = 0;
  }
LAB_00179b29:
  return SUB41(uVar5,0);
}

Assistant:

bool RegVmLoweredFunction::TransferRegisterTo(VmValue *value, unsigned char reg)
{
	VmInstruction *instruction = getType<VmInstruction>(value);

	assert(instruction);

	if(IsNonLocalValue(instruction))
		return false;

	for(unsigned i = 0; i < constantRegisters.size(); i++)
	{
		if(constantRegisters[i] == reg)
		{
			assert(registerUsers[reg] == 1);

			constantRegisters[i] = constantRegisters.back();
			constantRegisters.pop_back();

			instruction->regVmRegisters.push_back(reg);

			return true;
		}
	}

	for(unsigned i = 0; i < delayedFreedRegisters.size(); i++)
	{
		if(delayedFreedRegisters[i] == reg)
		{
			assert(registerUsers[reg] == 0);

			delayedFreedRegisters[i] = delayedFreedRegisters.back();
			delayedFreedRegisters.pop_back();

			instruction->regVmRegisters.push_back(reg);

			registerUsers[reg]++;

			return true;
		}
	}

	for(unsigned i = 0; i < freedRegisters.size(); i++)
	{
		if(freedRegisters[i] == reg)
		{
			assert(registerUsers[reg] == 0);

			freedRegisters[i] = freedRegisters.back();
			freedRegisters.pop_back();

			instruction->regVmRegisters.push_back(reg);

			registerUsers[reg]++;

			return true;
		}
	}

	return false;
}